

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O1

int tokgetlin(tokcxdef *ctx,int dopound)

{
  ushort *puVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  lindef *plVar5;
  lindef *plVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  uchar *puVar10;
  uchar *__dest;
  ushort **ppuVar12;
  uint uVar13;
  char *pcVar14;
  char *pcVar15;
  uint uVar16;
  char *pcVar17;
  size_t __n;
  long lVar18;
  bool bVar19;
  ulong uVar11;
  
LAB_00116d14:
  while( true ) {
    iVar8 = (*ctx->tokcxlin->lingetp)(ctx->tokcxlin);
    plVar5 = ctx->tokcxlin;
    if (iVar8 == 0) break;
    plVar6 = plVar5->linpar;
    if (plVar6 == (lindef *)0x0) {
      if (ctx->tokcxifcnt == 0) {
        return 1;
      }
      errlogf(ctx->tokcxerr,"TADS",0x77);
      return 1;
    }
    (*plVar5->linclsp)(plVar5);
    if (ctx->tokcxdbg == (dbgcxdef *)0x0) {
      free(ctx->tokcxlin);
    }
    ctx->tokcxlin = plVar6;
    if ((plVar6->linflg & 0x10) == 0) {
      *(byte *)&ctx->tokcxflg = (byte)ctx->tokcxflg & 0xfb;
    }
    else {
      *(byte *)&ctx->tokcxflg = (byte)ctx->tokcxflg | 4;
    }
  }
  if ((plVar5->linflg & 2) == 0) {
    ctx->tokcxptr = plVar5->linbuf;
    ctx->tokcxlen = plVar5->linlen;
  }
  else {
    if (ctx->tokcxbuf == (char *)0x0) {
      puVar10 = mchalo(ctx->tokcxerr,0x400,"tok");
      ctx->tokcxbuf = (char *)puVar10;
      ctx->tokcxbsz = 0x400;
    }
    ctx->tokcxlen = 0;
    puVar10 = (uchar *)ctx->tokcxbuf;
    uVar13 = (uint)ctx->tokcxbsz;
    do {
      uVar4 = ctx->tokcxlin->linlen;
      ctx->tokcxlen = ctx->tokcxlen + uVar4;
      uVar3 = ctx->tokcxlin->linflg;
      if (uVar13 <= uVar4) {
        if (0x8000 < ctx->tokcxbsz) {
          errsigf(ctx->tokcxerr,"TADS",0x6e);
        }
        uVar13 = uVar13 + 0x1000;
        uVar7 = ctx->tokcxbsz + 0x1000;
        ctx->tokcxbsz = uVar7;
        __dest = mchalo(ctx->tokcxerr,(ulong)uVar7,"tok");
        memcpy(__dest,ctx->tokcxbuf,(long)puVar10 - (long)ctx->tokcxbuf);
        puVar10 = __dest + ((long)puVar10 - (long)ctx->tokcxbuf);
        free(ctx->tokcxbuf);
        ctx->tokcxbuf = (char *)__dest;
      }
      memcpy(puVar10,ctx->tokcxlin->linbuf,(ulong)uVar4);
      puVar10 = puVar10 + uVar4;
    } while ((((uVar3 & 2) != 0) && (iVar8 = (*ctx->tokcxlin->lingetp)(ctx->tokcxlin), iVar8 == 0))
            && (uVar13 = uVar13 - uVar4, (uVar3 & 2) != 0));
    *puVar10 = '\0';
    ctx->tokcxptr = ctx->tokcxbuf;
  }
  if (dopound != 0) {
    uVar4 = ctx->tokcxlen;
    if (((uVar4 != 0) && (pcVar15 = ctx->tokcxptr, *pcVar15 == '#')) &&
       ((ctx->tokcxlin->linflg & 8) == 0)) {
      uVar9 = uVar4 - 1;
      uVar11 = (ulong)uVar9;
      pcVar14 = pcVar15 + uVar11 + 1;
      pcVar17 = pcVar15;
      uVar13 = (uint)uVar4;
      do {
        uVar16 = uVar13;
        uVar13 = (uint)uVar11;
        pcVar17 = pcVar17 + 1;
        bVar19 = uVar9 == 0;
        uVar9 = uVar9 - 1;
        if (bVar19) {
          uVar13 = 0;
          uVar16 = 1;
          pcVar15 = pcVar14;
          break;
        }
        cVar2 = *pcVar17;
        if ((long)cVar2 < 0) {
          uVar16 = uVar13 + 1;
          pcVar15 = pcVar17;
          break;
        }
        pcVar15 = pcVar15 + 1;
        ppuVar12 = __ctype_b_loc();
        uVar13 = uVar16 - 1;
        uVar11 = (ulong)uVar9;
      } while ((*(byte *)((long)*ppuVar12 + (long)cVar2 * 2 + 1) & 0x20) != 0);
      lVar18 = 0;
      do {
        uVar9 = *(uint *)((long)&tokgetlin::dir[0].len + lVar18);
        __n = (size_t)(int)uVar9;
        if ((((int)uVar9 < (int)uVar16) &&
            (iVar8 = bcmp(pcVar15,*(void **)((long)&tokgetlin::dir[0].nm + lVar18),__n), iVar8 == 0)
            ) && ((uVar13 == uVar9 ||
                  ((cVar2 = pcVar15[__n], -1 < (long)cVar2 &&
                   (ppuVar12 = __ctype_b_loc(),
                   (*(byte *)((long)*ppuVar12 + (long)cVar2 * 2 + 1) & 0x20) != 0)))))) {
          tokgetlin::dirp = (anon_struct_24_4_067c1e49 *)((long)&tokgetlin::dir[0].nm + lVar18);
          if ((*(int *)((long)&tokgetlin::dir[0].ok_in_if + lVar18) == 0) &&
             ((ctx->tokcxifcnt != 0 && ((ctx->tokcxifcur & 0xfffffffdU) != 1)))) goto LAB_00116d14;
          pcVar15 = pcVar15 + __n;
          iVar8 = uVar13 - uVar9;
          if (iVar8 == 0) goto LAB_00117055;
          goto LAB_00117020;
        }
        lVar18 = lVar18 + 0x18;
      } while ((int)lVar18 != 0x108);
      errlogf(ctx->tokcxerr,"TADS",0x68);
      goto LAB_00116d14;
    }
  }
  if ((ctx->tokcxifcnt == 0) || ((ctx->tokcxifcur != 2 && (ctx->tokcxifcur != 4)))) {
    puVar1 = &ctx->tokcxlin->linflg;
    *puVar1 = *puVar1 & 0xfffb;
    return 0;
  }
  goto LAB_00116d14;
  while( true ) {
    pcVar15 = pcVar15 + 1;
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) break;
LAB_00117020:
    cVar2 = *pcVar15;
    if (((long)cVar2 < 0) ||
       (ppuVar12 = __ctype_b_loc(), (*(byte *)((long)*ppuVar12 + (long)cVar2 * 2 + 1) & 0x20) == 0))
    goto LAB_00117055;
  }
  iVar8 = 0;
LAB_00117055:
  (**(code **)((long)&tokgetlin::dir[0].fn + lVar18))(ctx,pcVar15,iVar8);
  goto LAB_00116d14;
}

Assistant:

static int tokgetlin(tokcxdef *ctx, int dopound)
{
    for (;;)
    {
        if (linget(ctx->tokcxlin))
        {
            /* at eof in current source; resume parent if there is one */
            if (ctx->tokcxlin->linpar)
            {
                lindef *parent;
                
                parent = ctx->tokcxlin->linpar;          /* remember parent */
                lincls(ctx->tokcxlin);               /* close included file */
                if (!ctx->tokcxdbg)               /* if no debug context... */
                    mchfre(ctx->tokcxlin);              /* free line source */
                ctx->tokcxlin = parent;      /* reset to parent line source */
                if (parent->linflg & LINFCMODE)
                    ctx->tokcxflg |= TOKCXFCMODE;
                else
                    ctx->tokcxflg &= ~TOKCXFCMODE;
                continue;                       /* back for another attempt */
            }
            else
            {
                /* check for outstanding #if/#ifdef */
                if (ctx->tokcxifcnt)
                    errlog(ctx->tokcxerr, ERR_NOENDIF);

                /* return end-of-file indication */
                return TRUE;
            }
        }
        
        /* if this is a multi-segment line, copy it into our own buffer */
        if (ctx->tokcxlin->linflg & LINFMORE)
        {
            char *p;
            uint  rem;
            int   done;
            
            if (!ctx->tokcxbuf)
            {
                /* allocate 1k as a default buffer */
                ctx->tokcxbuf = (char *)mchalo(ctx->tokcxerr, 1024,
                                               "tok");
                ctx->tokcxbsz = 1024;
            }
            ctx->tokcxlen = 0;
            
            for (done = FALSE, p = ctx->tokcxbuf, rem = ctx->tokcxbsz ;
                 !done ; )
            {
                size_t len = ctx->tokcxlin->linlen;

                /* add the current segment's length into line length */
                ctx->tokcxlen += len;
                
                /* we're done after this piece if the last fetch was all */
                done = !(ctx->tokcxlin->linflg & LINFMORE);
                if (len + 1 > rem)
                {
                    char *newp;

                    /* increase the size of the buffer */
                    if (ctx->tokcxbsz > (unsigned)0x8000)
                        errsig(ctx->tokcxerr, ERR_LONGLIN);
                    rem += 4096;
                    ctx->tokcxbsz += 4096;
                    
                    /* allocate a new buffer and copy line into it */
                    newp = (char *)mchalo(ctx->tokcxerr, ctx->tokcxbsz, "tok");
                    memcpy(newp, ctx->tokcxbuf, (size_t)(p - ctx->tokcxbuf));
                    
                    /* free the original buffer, and use the new one */
                    p = (p - ctx->tokcxbuf) + newp;
                    mchfre(ctx->tokcxbuf);
                    ctx->tokcxbuf = newp;
                }
                
                /* add the line to the buffer */
                memcpy(p, ctx->tokcxlin->linbuf, len);
                p += len;
                rem -= len;
                
                /* get the next piece of the line if there is one */
                if (!done)
                {
                    if (linget(ctx->tokcxlin)) break;
                }
            }
            
            /* null-terminate the buffer, and use it for input */
            *p = '\0';
            ctx->tokcxptr = ctx->tokcxbuf;
        }
        else
        {
            ctx->tokcxptr = ctx->tokcxlin->linbuf;
            ctx->tokcxlen = ctx->tokcxlin->linlen;
        }
        
        /* check for preprocessor directives */
        if (dopound && ctx->tokcxlen != 0 && ctx->tokcxptr[0] == '#'
            && !(ctx->tokcxlin->linflg & LINFNOINC))
        {
            char   *p;
            int     len;
            static  struct
            {
                char  *nm;
                int    len;
                int    ok_in_if;
                void (*fn)(tokcxdef *, char *, int);
            }
            *dirp, dir[] =
            {
                { "include", 7, FALSE, tokinclude },
                { "pragma",  6, FALSE, tokpragma },
                { "define",  6, FALSE, tokdefine },
                { "ifdef",   5, TRUE, tokifdef },
                { "ifndef",  6, TRUE, tokifndef },
                { "if",      2, TRUE, tokif },
                { "else",    4, TRUE, tokelse },
                { "elif",    4, TRUE, tokelif },
                { "endif",   5, TRUE, tokendif },
                { "undef",   5, FALSE, tokundef },
                { "error",   5, FALSE, tok_p_error }
            };
            int  i;

            /* scan off spaces between '#' and directive */
            for (len = ctx->tokcxlen - 1, p = &ctx->tokcxptr[1] ;
                 len && t_isspace(*p) ; --len, ++p) ;

            /* find and process the directive */
            for (dirp = dir, i = sizeof(dir)/sizeof(dir[0]) ; i ; --i, ++dirp)
            {
                /* compare this directive; if it wins, call its function */
                if (len >= dirp->len && !memcmp(p, dirp->nm, (size_t)dirp->len)
                    && (len == dirp->len || t_isspace(*(p + dirp->len))))
                {
                    int cnt;
                    int stat;
                    
                    /*
                     *   if we're not in a #if's false part, or if the
                     *   directive is processed even in #if false parts,
                     *   process the line, otherwise skip it 
                     */
                    cnt = ctx->tokcxifcnt;
                    if (dirp->ok_in_if || cnt == 0
                        || ((stat = ctx->tokcxifcur) == TOKIF_IF_YES
                            || stat == TOKIF_ELSE_YES))
                    {
                        /* skip whitespace following the directive */
                        for (p += dirp->len, len -= dirp->len ;
                             len && t_isspace(*p) ;
                             --len, ++p) ;

                        /* invoke the function to process this directive */
                        (*dirp->fn)(ctx, p, len);
                    }

                    /* there's no need to look at more directives */
                    break;
                }
            }

            /* if we didn't find anything, flag the error */
            if (i == 0)
                errlog(ctx->tokcxerr, ERR_PRPDIR);

            /* ignore this line */
            continue;
        }
        else
        {
            /*
             *   Check the #if level.  If we're in an #if, and we're to
             *   ignore lines (because of a false condition or an #else
             *   part for a true condition), skip this line. 
             */
            if (ctx->tokcxifcnt != 0)
            {
                switch(ctx->tokcxifcur)
                {
                case TOKIF_IF_NO:
                case TOKIF_ELSE_NO:
                    /* ignore this line */
                    continue;

                default:
                    /* we're in a true part - keep the line */
                    break;
                }
            }
            
            ctx->tokcxlin->linflg &= ~LINFDBG;       /* no debug record yet */
            return(FALSE);                      /* return the line we found */
        }
    }
}